

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O0

void __thiscall
RecursionState::RecursionState<WorkerMemory<ImputedData<int,double>,double,double>>
          (RecursionState *this,WorkerMemory<ImputedData<int,_double>,_double,_double> *workspace,
          bool full_state)

{
  value_type vVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  reference pvVar6;
  reference pvVar7;
  type pdVar8;
  double *pdVar9;
  byte in_DL;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  undefined8 *in_RDI;
  size_t ix_1;
  size_t ix;
  size_t tot;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff08;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_ffffffffffffff10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff18;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  allocator_type *in_stack_ffffffffffffff38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff40;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  ulong local_88;
  ulong local_80;
  undefined1 local_61 [9];
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  
  __first._M_current = in_RDI + 8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x22fddd);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x22fdf0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x22fe06);
  std::unique_ptr<double[],std::default_delete<double[]>>::
  unique_ptr<std::default_delete<double[]>,void>
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_ffffffffffffff10);
  *(byte *)((long)in_RDI + 0x39) = in_DL & 1;
  in_RDI[3] = in_RSI[5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
  in_RDI[4] = in_RSI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
  bVar3 = ColumnSampler<double>::has_weights((ColumnSampler<double> *)0x22fe62);
  if (bVar3) {
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    in_RDI[6] = in_RSI[0x13].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    in_RDI[5] = in_RSI[0x11].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  if ((*(byte *)((long)in_RDI + 0x39) & 1) != 0) {
    *in_RDI = in_RSI[3].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    in_RDI[1] = in_RSI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
    in_RDI[2] = in_RSI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    *(byte *)(in_RDI + 7) =
         *(byte *)&in_RSI[9].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage & 1;
    bVar3 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffff20);
    if ((bVar3) &&
       (in_RSI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish <
        in_RSI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage)) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffff08);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   *)in_stack_ffffffffffffff18,(difference_type)in_stack_ffffffffffffff10);
      local_61._1_8_ =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     (in_stack_ffffffffffffff08);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   *)in_stack_ffffffffffffff18,(difference_type)in_stack_ffffffffffffff10);
      __last._M_current = (unsigned_long *)local_61;
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x22ffe2);
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                (in_stack_ffffffffffffff40,__first,__last,in_stack_ffffffffffffff38);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff18);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff20)
      ;
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x230036);
      if ((*(byte *)(in_RDI + 7) & 1) != 0) {
        uVar4 = (long)in_RSI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                (long)in_RSI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar4;
        uVar5 = SUB168(auVar2 * ZEXT816(8),0);
        if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
          uVar5 = 0xffffffffffffffff;
        }
        operator_new__(uVar5);
        std::unique_ptr<double[],std::default_delete<double[]>>::
        unique_ptr<double*,std::default_delete<double[]>,void,bool>
                  ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_ffffffffffffff10
                   ,(double *)in_stack_ffffffffffffff08);
        std::unique_ptr<double[],_std::default_delete<double[]>_>::operator=
                  ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_ffffffffffffff10
                   ,(unique_ptr<double[],_std::default_delete<double[]>_> *)
                    in_stack_ffffffffffffff08);
        std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
                  ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_ffffffffffffff10
                  );
        bVar3 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffff20);
        if (bVar3) {
          for (local_88 = 0; local_88 < uVar4; local_88 = local_88 + 1) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (in_RSI,local_88 +
                              (long)in_RSI[4].
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
            pdVar9 = tsl::
                     robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                     ::operator[](in_stack_ffffffffffffff10,
                                  (unsigned_long *)in_stack_ffffffffffffff08);
            in_stack_ffffffffffffff08 =
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pdVar9;
            in_stack_ffffffffffffff10 =
                 (robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                  *)std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                              ((unique_ptr<double[],_std::default_delete<double[]>_> *)
                               in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
            (((__uniq_ptr_impl<double,_std::default_delete<double[]>_> *)
             &(in_stack_ffffffffffffff10->m_ht).super_power_of_two_growth_policy<2UL>)->_M_t).
            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
            super__Head_base<0UL,_double_*,_false>._M_head_impl =
                 (double *)in_stack_ffffffffffffff08;
          }
        }
        else {
          for (local_80 = 0; local_80 < uVar4; local_80 = local_80 + 1) {
            pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (in_RSI,local_80 +
                                       (long)in_RSI[4].
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_finish);
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)
                                &in_RSI[8].
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,*pvVar6);
            vVar1 = *pvVar7;
            pdVar8 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                               ((unique_ptr<double[],_std::default_delete<double[]>_> *)
                                in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
            *pdVar8 = vVar1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

RecursionState::RecursionState(WorkerMemory &workspace, bool full_state)
{
    this->full_state = full_state;

    this->split_ix         =  workspace.split_ix;
    this->end              =  workspace.end;
    if (!workspace.col_sampler.has_weights())
        this->sampler_pos  =  workspace.col_sampler.curr_pos;
    else {
        this->col_sampler_weights = workspace.col_sampler.tree_weights;
        this->n_dropped           = workspace.col_sampler.n_dropped;
    }

    if (this->full_state)
    {
        this->st           = workspace.st;
        this->st_NA        = workspace.st_NA;
        this->end_NA       = workspace.end_NA;

        this->changed_weights = workspace.changed_weights;

        /* for the extended model, it's not necessary to copy everything */
        if (workspace.comb_val.empty() && workspace.st_NA < workspace.end_NA)
        {
            this->ix_arr = std::vector<size_t>(workspace.ix_arr.begin() + workspace.st_NA,
                                               workspace.ix_arr.begin() + workspace.end_NA);
            if (this->changed_weights)
            {
                size_t tot = workspace.end_NA - workspace.st_NA;
                this->weights_arr = std::unique_ptr<double[]>(new double[tot]);
                if (!workspace.weights_arr.empty())
                    for (size_t ix = 0; ix < tot; ix++)
                        this->weights_arr[ix] = workspace.weights_arr[workspace.ix_arr[ix + workspace.st_NA]];
                else
                    for (size_t ix = 0; ix < tot; ix++)
                        this->weights_arr[ix] = workspace.weights_map[workspace.ix_arr[ix + workspace.st_NA]];
            }
        }
    }
}